

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O2

Sim_Man_t * Sim_ManStart(Abc_Ntk_t *pNtk,int fLightweight)

{
  int nSize;
  uint uVar1;
  Sim_Man_t *pSVar2;
  Vec_Ptr_t *pVVar3;
  Extra_MmFixed_t *pEVar4;
  Vec_Int_t *pVVar5;
  Vec_Vec_t *pVVar6;
  int nWords;
  
  pSVar2 = (Sim_Man_t *)calloc(1,0xa8);
  pSVar2->pNtk = pNtk;
  nSize = pNtk->vCis->nSize;
  pSVar2->nInputs = nSize;
  pSVar2->nOutputs = pNtk->vCos->nSize;
  pSVar2->nSimBits = 0x800;
  pSVar2->nSimWords = 0x40;
  pVVar3 = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,0x40,0);
  pSVar2->vSim0 = pVVar3;
  pSVar2->fLightweight = fLightweight;
  if (fLightweight == 0) {
    pVVar3 = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,0x40,0);
    pSVar2->vSim1 = pVVar3;
    uVar1 = pNtk->vCis->nSize;
    pSVar2->nSuppBits = uVar1;
    nWords = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
    pSVar2->nSuppWords = nWords;
    pVVar3 = Sim_ComputeStrSupp(pNtk);
    pSVar2->vSuppStr = pVVar3;
    pVVar3 = Sim_UtilInfoAlloc(pNtk->vCos->nSize,nWords,1);
    pSVar2->vSuppFun = pVVar3;
    pEVar4 = Extra_MmFixedStart(nWords * 4 + 0x10);
    pSVar2->pMmPat = pEVar4;
    pVVar3 = Vec_PtrAlloc(100);
    pSVar2->vFifo = pVVar3;
    pVVar5 = Vec_IntAlloc(100);
    pSVar2->vDiffs = pVVar5;
    pVVar6 = Vec_VecStart(nSize);
    pSVar2->vSuppTargs = pVVar6;
  }
  return pSVar2;
}

Assistant:

Sim_Man_t * Sim_ManStart( Abc_Ntk_t * pNtk, int fLightweight )
{
    Sim_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Sim_Man_t, 1 );
    memset( p, 0, sizeof(Sim_Man_t) );
    p->pNtk = pNtk;
    p->nInputs    = Abc_NtkCiNum(p->pNtk);
    p->nOutputs   = Abc_NtkCoNum(p->pNtk);
    // internal simulation information
    p->nSimBits   = 2048;
    p->nSimWords  = SIM_NUM_WORDS(p->nSimBits);
    p->vSim0      = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), p->nSimWords, 0 );
    p->fLightweight = fLightweight;
    if (!p->fLightweight) {
        p->vSim1      = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), p->nSimWords, 0 );
        // support information
        p->nSuppBits  = Abc_NtkCiNum(pNtk);
        p->nSuppWords = SIM_NUM_WORDS(p->nSuppBits);
        p->vSuppStr   = Sim_ComputeStrSupp( pNtk );
        p->vSuppFun   = Sim_UtilInfoAlloc( Abc_NtkCoNum(p->pNtk),  p->nSuppWords, 1 );
        // other data
        p->pMmPat     = Extra_MmFixedStart( sizeof(Sim_Pat_t) + p->nSuppWords * sizeof(unsigned) ); 
        p->vFifo      = Vec_PtrAlloc( 100 );
        p->vDiffs     = Vec_IntAlloc( 100 );
        // allocate support targets (array of unresolved outputs for each input)
        p->vSuppTargs = Vec_VecStart( p->nInputs );
    }
    return p;
}